

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  char *pcVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  char *pcVar2;
  undefined7 in_register_00000009;
  
  pcVar1 = (this->stack_).stackEnd_;
  pcVar2 = (this->stack_).stackTop_ + 0x18;
  if ((int)CONCAT71(in_register_00000009,copy) == 0) {
    if (pcVar1 <= pcVar2) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
    }
    pcVar1 = (this->stack_).stackTop_;
    (this->stack_).stackTop_ = pcVar1 + 0x18;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    pcVar1[0x10] = '\0';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\0';
    pcVar1[0x13] = '\0';
    if (str == (Ch *)0x0) {
      __assert_fail("s != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/document.h"
                    ,0x143,
                    "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                   );
    }
    pcVar1[0x10] = '\x05';
    pcVar1[0x11] = '\0';
    pcVar1[0x12] = '\x10';
    pcVar1[0x13] = '\0';
    *(Ch **)pcVar1 = str;
    *(SizeType *)(pcVar1 + 8) = length;
  }
  else {
    if (pcVar1 <= pcVar2) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&this->stack_,1);
    }
    this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(this->stack_).stackTop_;
    (this->stack_).stackTop_ = (char *)(this_00 + 1);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this_00,str,length,this->allocator_);
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) {
        if (copy)
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }